

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserBase.h
# Opt level: O2

void __thiscall AutoArgParse::ParseToken::~ParseToken(ParseToken *this)

{
  this->_vptr_ParseToken = (_func_int **)&PTR__ParseToken_00110890;
  std::__cxx11::string::~string((string *)&this->description);
  return;
}

Assistant:

virtual ~ParseToken() = default;